

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timeline.hpp
# Opt level: O2

microseconds __thiscall ableton::link::Timeline::fromBeats(Timeline *this,Beats *beats)

{
  microseconds mVar1;
  _Tuple_impl<0UL,_long> local_10;
  
  local_10.super__Head_base<0UL,_long,_false>._M_head_impl =
       (_Head_base<0UL,_long,_false>)
       ((beats->super_tuple<long>).super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>.
        _M_head_impl -
       (this->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl);
  mVar1 = Tempo::beatsToMicros(&this->tempo,(Beats *)&local_10);
  return (microseconds)(mVar1.__r + (this->timeOrigin).__r);
}

Assistant:

std::chrono::microseconds fromBeats(const Beats beats) const
  {
    return timeOrigin + tempo.beatsToMicros(beats - beatOrigin);
  }